

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_tonumber(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  jit_State *in_RSI;
  long in_RDI;
  TValue tmp;
  TRef base;
  TRef tr;
  TValue *in_stack_ffffffffffffffc8;
  jit_State *in_stack_ffffffffffffffd0;
  
  uVar3 = **(uint **)(in_RDI + 0x88);
  uVar1 = *(uint *)(*(long *)(in_RDI + 0x88) + 4);
  if (((uVar3 == 0) || ((uVar1 & 0x1f000000) == 0)) ||
     ((uVar1 = lj_opt_narrow_toint((jit_State *)&in_stack_ffffffffffffffc8->field_2,0),
      (uVar1 & 0xffff) < 0x8000 &&
      (*(int *)(*(long *)(in_RDI + 0x10) + (ulong)(uVar1 & 0xffff) * 8) == 10)))) {
    if (((uVar3 >> 0x18 & 0x1f) - 0xe < 6) || ((uVar3 & 0x1f000000) == 0x4000000)) {
      if ((uVar3 & 0x1f000000) == 0x4000000) {
        iVar2 = lj_strscan_num((GCstr *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        if (iVar2 == 0) {
          recff_nyi(in_stack_ffffffffffffffd0,(RecordFFData *)&in_stack_ffffffffffffffc8->field_2);
          return;
        }
        *(undefined2 *)(in_RDI + 0xa4) = 0x5c8e;
        *(short *)(in_RDI + 0xa0) = (short)uVar3;
        *(undefined2 *)(in_RDI + 0xa2) = 0;
        uVar3 = lj_opt_fold((jit_State *)CONCAT44(uVar3,uVar1));
      }
    }
    else {
      if ((uVar3 & 0x1f000000) == 0xa000000) {
        lj_crecord_tonumber(in_RSI,(RecordFFData *)CONCAT44(uVar3,uVar1));
        return;
      }
      uVar3 = 0x7fff;
    }
    **(TRef **)(in_RDI + 0x88) = uVar3;
  }
  else {
    recff_nyi(in_stack_ffffffffffffffd0,(RecordFFData *)&in_stack_ffffffffffffffc8->field_2);
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_tonumber(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  TRef base = J->base[1];
  if (tr && !tref_isnil(base)) {
    base = lj_opt_narrow_toint(J, base);
    if (!tref_isk(base) || IR(tref_ref(base))->i != 10) {
      recff_nyiu(J, rd);
      return;
    }
  }
  if (tref_isnumber_str(tr)) {
    if (tref_isstr(tr)) {
      TValue tmp;
      if (!lj_strscan_num(strV(&rd->argv[0]), &tmp)) {
	recff_nyiu(J, rd);  /* Would need an inverted STRTO for this case. */
	return;
      }
      tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
    }
#if LJ_HASFFI
  } else if (tref_iscdata(tr)) {
    lj_crecord_tonumber(J, rd);
    return;
#endif
  } else {
    tr = TREF_NIL;
  }
  J->base[0] = tr;
  UNUSED(rd);
}